

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_purge(CHAR_DATA *ch,char *argument)

{
  OBJ_DATA *pOVar1;
  DESCRIPTOR_DATA *dclose;
  OBJ_DATA *obj;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *pCVar5;
  char *txt;
  CHAR_DATA *ch_00;
  char buf [100];
  char arg [4608];
  char acStack_1298 [112];
  char local_1228 [4616];
  
  txt = acStack_1298;
  one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    pCVar5 = ch->in_room->people;
    while (ch_00 = pCVar5, ch_00 != (CHAR_DATA *)0x0) {
      pCVar5 = ch_00->next_in_room;
      bVar2 = is_npc(ch_00);
      if (((bVar2) && (ch_00 != ch)) && ((ch_00->act[0] & 0x200000U) == 0)) {
        extract_char(ch_00,true);
      }
    }
    pOVar1 = ch->in_room->contents;
    while (obj = pOVar1, obj != (OBJ_DATA *)0x0) {
      pOVar1 = obj->next_content;
      bVar2 = is_obj_stat(obj,0xe);
      if (!bVar2) {
        extract_obj(obj);
      }
    }
    act("$n purges the room!",ch,(void *)0x0,(void *)0x0,0);
    txt = "Ok.\n\r";
  }
  else {
    pCVar5 = get_char_world(ch,local_1228);
    if (pCVar5 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
    }
    else {
      bVar2 = is_npc(pCVar5);
      if (bVar2) {
        act("$n purges $N.",ch,(void *)0x0,pCVar5,1);
        extract_char(pCVar5,true);
        return;
      }
      if (pCVar5 == ch) {
        txt = "Ho ho ho.\n\r";
      }
      else {
        iVar3 = get_trust(ch);
        iVar4 = get_trust(pCVar5);
        if (iVar4 < iVar3) {
          act("$n disintegrates $N!",ch,(void *)0x0,pCVar5,1);
          if (1 < pCVar5->level) {
            save_char_obj(pCVar5);
          }
          dclose = pCVar5->desc;
          extract_char(pCVar5,true);
          if (dclose == (DESCRIPTOR_DATA *)0x0) {
            return;
          }
          close_socket(dclose);
          return;
        }
        send_to_char("Maybe that wasn\'t a good idea...\n\r",ch);
        sprintf(acStack_1298,"%s tried to purge you!\n\r",ch->name);
        ch = pCVar5;
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_purge(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[100];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	DESCRIPTOR_DATA *d;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		/* 'purge' */
		CHAR_DATA *vnext;
		OBJ_DATA *obj_next;

		for (victim = ch->in_room->people; victim != nullptr; victim = vnext)
		{
			vnext = victim->next_in_room;

			if (is_npc(victim) && !IS_SET(victim->act, ACT_NOPURGE) && victim != ch /* safety precaution */)
				extract_char(victim, true);
		}

		for (obj = ch->in_room->contents; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			if (!is_obj_stat(obj, ITEM_NOPURGE))
				extract_obj(obj);
		}

		act("$n purges the room!", ch, nullptr, nullptr, TO_ROOM);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		if (ch == victim)
		{
			send_to_char("Ho ho ho.\n\r", ch);
			return;
		}

		if (get_trust(ch) <= get_trust(victim))
		{
			send_to_char("Maybe that wasn't a good idea...\n\r", ch);
			sprintf(buf, "%s tried to purge you!\n\r", ch->name);
			send_to_char(buf, victim);
			return;
		}

		act("$n disintegrates $N!", ch, 0, victim, TO_NOTVICT);

		if (victim->level > 1)
			save_char_obj(victim);

		d = victim->desc;
		extract_char(victim, true);

		if (d != nullptr)
			close_socket(d);

		return;
	}

	act("$n purges $N.", ch, nullptr, victim, TO_NOTVICT);
	extract_char(victim, true);
}